

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O1

int Abc_DesFindTopLevelModels(Abc_Des_t *p)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  
  pVVar6 = p->vModules;
  lVar5 = (long)pVVar6->nSize;
  if (lVar5 < 1) {
    __assert_fail("Vec_PtrSize( p->vModules ) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcLib.c"
                  ,0x12a,"int Abc_DesFindTopLevelModels(Abc_Des_t *)");
  }
  ppvVar7 = pVVar6->pArray;
  lVar8 = 0;
  do {
    *(undefined4 *)((long)ppvVar7[lVar8] + 0xc0) = 0;
    lVar8 = lVar8 + 1;
  } while (lVar5 != lVar8);
  ppvVar7 = pVVar6->pArray;
  lVar8 = 0;
  do {
    lVar2 = *(long *)((long)ppvVar7[lVar8] + 0x50);
    lVar9 = (long)*(int *)(lVar2 + 4);
    if (0 < lVar9) {
      lVar2 = *(long *)(lVar2 + 8);
      lVar10 = 0;
      do {
        lVar3 = *(long *)(lVar2 + lVar10 * 8);
        if (((*(uint *)(lVar3 + 0x14) & 0xf) != 8) && (lVar3 = *(long *)(lVar3 + 0x38), lVar3 != 0))
        {
          *(undefined4 *)(lVar3 + 0xc0) = 1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar9 != lVar10);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != lVar5);
  p->vTops->nSize = 0;
  pVVar6 = p->vModules;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      pvVar4 = pVVar6->pArray[lVar5];
      if (*(int *)((long)pvVar4 + 0xc0) == 0) {
        pVVar6 = p->vTops;
        uVar1 = pVVar6->nCap;
        if (pVVar6->nSize == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
            }
            pVVar6->pArray = ppvVar7;
            iVar11 = 0x10;
          }
          else {
            iVar11 = uVar1 * 2;
            if (iVar11 <= (int)uVar1) goto LAB_00868c93;
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
            }
            pVVar6->pArray = ppvVar7;
          }
          pVVar6->nCap = iVar11;
        }
LAB_00868c93:
        iVar11 = pVVar6->nSize;
        pVVar6->nSize = iVar11 + 1;
        pVVar6->pArray[iVar11] = pvVar4;
      }
      else {
        *(undefined4 *)((long)pvVar4 + 0xc0) = 0;
      }
      lVar5 = lVar5 + 1;
      pVVar6 = p->vModules;
    } while (lVar5 < pVVar6->nSize);
  }
  return p->vTops->nSize;
}

Assistant:

int Abc_DesFindTopLevelModels( Abc_Des_t * p )
{
    Abc_Ntk_t * pNtk, * pNtkBox;
    Abc_Obj_t * pObj;
    int i, k;
    assert( Vec_PtrSize( p->vModules ) > 0 );
    // clear the models
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
        pNtk->fHieVisited = 0;
    // mark all the models reachable from other models
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
    {
        Abc_NtkForEachBox( pNtk, pObj, k )
        {
            if ( Abc_ObjIsLatch(pObj) )
                continue;
            if ( pObj->pData == NULL )
                continue;
            pNtkBox = (Abc_Ntk_t *)pObj->pData;
            pNtkBox->fHieVisited = 1;
        }
    }
    // collect the models that are not marked
    Vec_PtrClear( p->vTops );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtk, i )
    {
        if ( pNtk->fHieVisited == 0 )
            Vec_PtrPush( p->vTops, pNtk );
        else
            pNtk->fHieVisited = 0;
    }
    return Vec_PtrSize( p->vTops );
}